

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O1

Facet * ear::_adjacent_verts
                  (Facet *__return_storage_ptr__,
                  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *facets,int vert)

{
  _Rb_tree_header *p_Var1;
  pointer psVar2;
  _Rb_tree_const_iterator<int> __first;
  _Rb_tree_color _Var3;
  _Rb_tree_const_iterator<int> _Var4;
  set<int,_std::less<int>,_std::allocator<int>_> *facetVerts;
  pointer psVar5;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar6;
  _Rb_tree_color local_34;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar2 = (facets->
           super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_34 = vert;
  for (psVar5 = (facets->
                super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; _Var3 = local_34, psVar5 != psVar2;
      psVar5 = psVar5 + 1) {
    p_Var1 = &(psVar5->_M_t)._M_impl.super__Rb_tree_header;
    __first._M_node = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    for (_Var4._M_node = __first._M_node;
        ((_Rb_tree_header *)_Var4._M_node != p_Var1 && (_Var4._M_node[1]._M_color != _Var3));
        _Var4._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var4._M_node)) {
    }
    if ((_Rb_tree_header *)_Var4._M_node != p_Var1) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_range_unique<std::_Rb_tree_const_iterator<int>>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 __return_storage_ptr__,__first,(_Rb_tree_const_iterator<int>)p_Var1);
    }
  }
  pVar6 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          equal_range(&__return_storage_ptr__->_M_t,(key_type *)&local_34);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
            (&__return_storage_ptr__->_M_t,(_Base_ptr)pVar6.first._M_node,
             (_Base_ptr)pVar6.second._M_node);
  return __return_storage_ptr__;
}

Assistant:

Facet _adjacent_verts(std::vector<Facet> facets, int vert) {
    std::set<int> ret;
    for (const auto& facetVerts : facets) {
      if (std::find(facetVerts.begin(), facetVerts.end(), vert) !=
          facetVerts.end()) {
        ret.insert(facetVerts.begin(), facetVerts.end());
      }
    }
    ret.erase(vert);
    return ret;
  }